

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPServer.cpp
# Opt level: O0

void __thiscall SocketPP::TCPServer::onConnected(TCPServer *this,int fd)

{
  bool bVar1;
  char *pcVar2;
  size_type sVar3;
  char *local_40;
  char *local_38;
  char *local_30;
  char *local_28;
  TCPStream local_18;
  int local_14;
  TCPStream stream;
  int fd_local;
  TCPServer *this_local;
  
  local_14 = fd;
  _stream = this;
  TCPStream::TCPStream(&local_18,fd);
  pcVar2 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/TCPServer.cpp"
                   ,0x2f);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/TCPServer.cpp"
                     ,0x5c);
    if (pcVar2 == (char *)0x0) {
      local_30 = 
      "/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/TCPServer.cpp"
      ;
    }
    else {
      local_30 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/TCPServer.cpp"
                         ,0x5c);
      local_30 = local_30 + 1;
    }
    local_28 = local_30;
  }
  else {
    local_28 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/TCPServer.cpp"
                       ,0x2f);
    local_28 = local_28 + 1;
  }
  printf("\x1b[33m%s: get an accept:%d\x1b[m\n",local_28,(ulong)(uint)local_18.fd);
  std::mutex::lock(&this->streamMutex_);
  std::vector<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>::push_back
            (&this->connectedStreams_,&local_18);
  std::mutex::unlock(&this->streamMutex_);
  pcVar2 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/TCPServer.cpp"
                   ,0x2f);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/TCPServer.cpp"
                     ,0x5c);
    if (pcVar2 == (char *)0x0) {
      local_40 = 
      "/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/TCPServer.cpp"
      ;
    }
    else {
      local_40 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/TCPServer.cpp"
                         ,0x5c);
      local_40 = local_40 + 1;
    }
    local_38 = local_40;
  }
  else {
    local_38 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/shuai132[P]SocketPP/socketpp/TCPServer.cpp"
                       ,0x2f);
    local_38 = local_38 + 1;
  }
  sVar3 = std::vector<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>::size
                    (&this->connectedStreams_);
  printf("\x1b[33m%s: connectedStreams_.size()=%ld\x1b[m\n",local_38,sVar3);
  bVar1 = std::function::operator_cast_to_bool((function *)&this->connHandle_);
  if (bVar1) {
    std::function<void_(const_SocketPP::TCPStream_&)>::operator()(&this->connHandle_,&local_18);
  }
  return;
}

Assistant:

void TCPServer::onConnected(int fd) {
    TCPStream stream(fd);

    LOGD("get an accept:%d", stream.fd);
    streamMutex_.lock();
    connectedStreams_.push_back(stream);
    streamMutex_.unlock();

    LOGD("connectedStreams_.size()=%ld", connectedStreams_.size());

    if (connHandle_)
        connHandle_(stream);
}